

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_trace(sqlite3 *db,_func_void_void_ptr_char_ptr *xTrace,void *pArg)

{
  void *pvVar1;
  u8 uVar2;
  void *pOld;
  void *pArg_local;
  _func_void_void_ptr_char_ptr *xTrace_local;
  sqlite3 *db_local;
  
  sqlite3_mutex_enter(db->mutex);
  pvVar1 = db->pTraceArg;
  uVar2 = '\0';
  if (xTrace != (_func_void_void_ptr_char_ptr *)0x0) {
    uVar2 = '@';
  }
  db->mTrace = uVar2;
  db->xTrace = (_func_int_u32_void_ptr_void_ptr_void_ptr *)xTrace;
  db->pTraceArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_trace(sqlite3 *db, void(*xTrace)(void*,const char*), void *pArg){
  void *pOld;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pOld = db->pTraceArg;
  db->mTrace = xTrace ? SQLITE_TRACE_LEGACY : 0;
  db->xTrace = (int(*)(u32,void*,void*,void*))xTrace;
  db->pTraceArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pOld;
}